

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O1

void __thiscall crnlib::mipmapped_texture::swap(mipmapped_texture *this,mipmapped_texture *img)

{
  uint uVar1;
  component_flags cVar2;
  pixel_format pVar3;
  format fVar4;
  vector<crnlib::mip_level_*> *pvVar5;
  
  uVar1 = this->m_width;
  this->m_width = img->m_width;
  img->m_width = uVar1;
  uVar1 = this->m_height;
  this->m_height = img->m_height;
  img->m_height = uVar1;
  cVar2 = this->m_comp_flags;
  this->m_comp_flags = img->m_comp_flags;
  img->m_comp_flags = cVar2;
  pVar3 = this->m_format;
  this->m_format = img->m_format;
  img->m_format = pVar3;
  pvVar5 = (this->m_faces).m_p;
  (this->m_faces).m_p = (img->m_faces).m_p;
  (img->m_faces).m_p = pvVar5;
  uVar1 = (this->m_faces).m_size;
  (this->m_faces).m_size = (img->m_faces).m_size;
  (img->m_faces).m_size = uVar1;
  uVar1 = (this->m_faces).m_capacity;
  (this->m_faces).m_capacity = (img->m_faces).m_capacity;
  (img->m_faces).m_capacity = uVar1;
  dynamic_string::swap(&this->m_last_error,&img->m_last_error);
  fVar4 = this->m_source_file_type;
  this->m_source_file_type = img->m_source_file_type;
  img->m_source_file_type = fVar4;
  return;
}

Assistant:

void mipmapped_texture::swap(mipmapped_texture& img) {
    std::swap(m_width, img.m_width);
    std::swap(m_height, img.m_height);
    std::swap(m_comp_flags, img.m_comp_flags);
    std::swap(m_format, img.m_format);
  m_faces.swap(img.m_faces);
  m_last_error.swap(img.m_last_error);
  std::swap(m_source_file_type, img.m_source_file_type);

  CRNLIB_ASSERT(check());
}